

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.cc
# Opt level: O0

int X509_signature_dump(BIO *bp,ASN1_STRING *sig,int indent)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int local_34;
  int n;
  int i;
  uint8_t *s;
  int indent_local;
  ASN1_STRING *sig_local;
  BIO *bp_local;
  
  iVar3 = sig->length;
  puVar1 = sig->data;
  local_34 = 0;
  while( true ) {
    if (iVar3 <= local_34) {
      iVar3 = BIO_write(bp,"\n",1);
      bp_local._4_4_ = (uint)(iVar3 == 1);
      return bp_local._4_4_;
    }
    if ((local_34 % 0x12 == 0) &&
       ((iVar2 = BIO_write(bp,"\n",1), iVar2 < 1 ||
        (iVar2 = BIO_indent(bp,indent,indent), iVar2 < 1)))) break;
    pcVar4 = ":";
    if (local_34 + 1 == iVar3) {
      pcVar4 = "";
    }
    iVar2 = BIO_printf(bp,"%02x%s",(ulong)puVar1[local_34],pcVar4);
    if (iVar2 < 1) {
      return 0;
    }
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

int X509_signature_dump(BIO *bp, const ASN1_STRING *sig, int indent) {
  const uint8_t *s;
  int i, n;

  n = sig->length;
  s = sig->data;
  for (i = 0; i < n; i++) {
    if ((i % 18) == 0) {
      if (BIO_write(bp, "\n", 1) <= 0 || BIO_indent(bp, indent, indent) <= 0) {
        return 0;
      }
    }
    if (BIO_printf(bp, "%02x%s", s[i], ((i + 1) == n) ? "" : ":") <= 0) {
      return 0;
    }
  }
  if (BIO_write(bp, "\n", 1) != 1) {
    return 0;
  }

  return 1;
}